

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  Byte BVar1;
  byte bVar2;
  char cVar3;
  CSzData *pCVar4;
  UInt64 UVar5;
  SRes SVar6;
  int iVar7;
  int iVar8;
  UInt64 *pUVar9;
  size_t *psVar10;
  UInt32 *pUVar11;
  Byte *pBVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  UInt32 UVar19;
  UInt32 UVar20;
  UInt32 UVar21;
  CSzAr *pCVar22;
  CSzBitUi32s *p_00;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  bool bVar27;
  CSzData local_118;
  CSzAr *local_108;
  UInt32 local_100;
  UInt32 index_1;
  CSzData *local_f8;
  uint local_ec;
  ulong local_e8;
  CSzData *local_e0;
  UInt64 type;
  UInt32 numCoders;
  UInt32 numFolders;
  byte *local_c8;
  size_t local_c0;
  UInt64 packSize;
  UInt32 coderOutStreams;
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar6 = ReadNumber(sd,&type);
  if (SVar6 != 0) {
    return SVar6;
  }
  local_108 = p;
  if (type == 6) {
    SVar6 = ReadNumber(sd,dataOffset);
    pCVar22 = local_108;
    if (SVar6 != 0) {
      return SVar6;
    }
    SVar6 = SzReadNumber32(sd,&local_108->NumPackStreams);
    if (SVar6 != 0) {
      return SVar6;
    }
    SVar6 = WaitId(sd,9);
    if (SVar6 != 0) {
      return SVar6;
    }
    pUVar9 = (UInt64 *)(*alloc->Alloc)(alloc,(ulong)pCVar22->NumPackStreams * 8 + 8);
    pCVar22->PackPositions = pUVar9;
    if (pUVar9 == (UInt64 *)0x0) {
      return 2;
    }
    local_f8 = (CSzData *)(ulong)pCVar22->NumPackStreams;
    uVar24 = 0;
    uVar15 = 0;
    local_e0 = sd;
    while (sd = local_e0, pCVar22 = local_108, local_f8 != (CSzData *)uVar24) {
      local_108->PackPositions[uVar24] = uVar15;
      SVar6 = ReadNumber(local_e0,&packSize);
      if (SVar6 != 0) {
        return SVar6;
      }
      uVar24 = uVar24 + 1;
      bVar27 = CARRY8(uVar15,packSize);
      uVar15 = uVar15 + packSize;
      if (bVar27) {
        return 0x10;
      }
    }
    local_108->PackPositions[(long)local_f8] = uVar15;
    do {
      SVar6 = ReadNumber(sd,&packSize);
      if (SVar6 != 0) {
        return SVar6;
      }
      if (packSize == 10) {
        iVar7 = SkipBitUi32s(sd,pCVar22->NumPackStreams);
      }
      else {
        if (packSize == 0) {
          SVar6 = ReadNumber(sd,&type);
          if (SVar6 != 0) {
            return SVar6;
          }
          break;
        }
        iVar7 = SkipData(sd);
      }
      if (iVar7 != 0) {
        return iVar7;
      }
    } while( true );
  }
  if (type == 7) {
    SVar6 = WaitId(sd,0xb);
    pCVar22 = local_108;
    if (SVar6 != 0) {
      return SVar6;
    }
    SVar6 = SzReadNumber32(sd,&numFolders);
    if (SVar6 != 0) {
      return SVar6;
    }
    local_f8 = (CSzData *)(ulong)numFolders;
    if (numFoldersMax < numFolders) {
      return 4;
    }
    pCVar22->NumFolders = numFolders;
    if (sd->Size == 0) {
      return 0x10;
    }
    sd->Size = sd->Size - 1;
    pBVar12 = sd->Data;
    sd->Data = pBVar12 + 1;
    BVar1 = *pBVar12;
    if (BVar1 == '\0') {
      local_118.Data = sd->Data;
      local_118.Size = sd->Size;
    }
    else {
      SVar6 = SzReadNumber32(sd,(UInt32 *)&packSize);
      if (SVar6 != 0) {
        return SVar6;
      }
      if (numTempBufs <= (uint)packSize) {
        return 0x10;
      }
      local_118.Data = tempBufs[packSize & 0xffffffff].data;
      local_118.Size = tempBufs[packSize & 0xffffffff].size;
    }
    pCVar4 = local_f8;
    psVar10 = (size_t *)(*alloc->Alloc)(alloc,(long)local_f8 * 8 + 8);
    pCVar22->FoCodersOffsets = psVar10;
    if (psVar10 == (size_t *)0x0) {
      return 2;
    }
    sVar26 = (long)pCVar4 * 4 + 4;
    pUVar11 = (UInt32 *)(*alloc->Alloc)(alloc,sVar26);
    pCVar22->FoStartPackStreamIndex = pUVar11;
    if (pUVar11 == (UInt32 *)0x0) {
      return 2;
    }
    pUVar11 = (UInt32 *)(*alloc->Alloc)(alloc,sVar26);
    pCVar22->FoToCoderUnpackSizes = pUVar11;
    if (pUVar11 == (UInt32 *)0x0) {
      return 2;
    }
    pBVar12 = (Byte *)(*alloc->Alloc)(alloc,(size_t)local_f8);
    pCVar22->FoToMainUnpackSizeIndex = pBVar12;
    if (pBVar12 == (Byte *)0x0) {
      return 2;
    }
    sVar26 = 0;
    local_ec = 0;
    local_100 = 0;
    local_c8 = local_118.Data;
    while( true ) {
      if ((CSzData *)sVar26 == local_f8) break;
      pCVar22->FoCodersOffsets[sVar26] = (long)local_118.Data - (long)local_c8;
      SVar6 = SzReadNumber32(&local_118,&numCoders);
      if (SVar6 != 0) {
        return SVar6;
      }
      local_e8 = (ulong)numCoders;
      if (numCoders - 0x41 < 0xffffffc0) {
        return 4;
      }
      uVar25 = 0;
      UVar20 = numCoders;
      local_c0 = sVar26;
      while (bVar27 = UVar20 != 0, UVar20 = UVar20 - 1, bVar27) {
        if (local_118.Size == 0) {
          return 0x10;
        }
        bVar2 = *local_118.Data;
        if (0x3f < bVar2) {
          return 4;
        }
        uVar14 = bVar2 & 0xf;
        uVar15 = (ulong)uVar14;
        if (8 < uVar14) {
          return 4;
        }
        uVar24 = local_118.Size - 1;
        local_118.Size = uVar24 - uVar15;
        if (uVar24 < uVar15) {
          return 0x10;
        }
        local_118.Data = local_118.Data + uVar15 + 1;
        packSize = CONCAT44(packSize._4_4_,1);
        uVar14 = 1;
        if ((bVar2 & 0x10) != 0) {
          local_e0 = (CSzData *)CONCAT44(local_e0._4_4_,uVar25);
          SVar6 = SzReadNumber32(&local_118,(UInt32 *)&packSize);
          if (SVar6 != 0) {
            return SVar6;
          }
          SVar6 = SzReadNumber32(&local_118,&coderOutStreams);
          if (SVar6 != 0) {
            return SVar6;
          }
          if (0x40 < (uint)packSize) {
            return 4;
          }
          uVar25 = (uint)local_e0;
          uVar14 = (uint)packSize;
          if (coderOutStreams != 1) {
            return 4;
          }
        }
        uVar25 = uVar25 + uVar14;
        if (0x1f < bVar2) {
          SVar6 = SzReadNumber32(&local_118,&coderOutStreams);
          if (SVar6 != 0) {
            return SVar6;
          }
          uVar15 = (ulong)coderOutStreams;
          bVar27 = local_118.Size < uVar15;
          local_118.Size = local_118.Size - uVar15;
          if (bVar27) {
            return 0x10;
          }
          local_118.Data = local_118.Data + uVar15;
        }
      }
      if ((uint)local_e8 == 1) {
        uVar15 = 0;
        uVar14 = 1;
        if (uVar25 != 1) goto LAB_0059b33f;
      }
      else {
LAB_0059b33f:
        uVar14 = uVar25 - ((uint)local_e8 - 1);
        if (uVar25 < (uint)local_e8 - 1) {
          return 0x10;
        }
        if (0x40 < uVar25) {
          return 4;
        }
        for (uVar15 = 0; uVar25 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined1 *)((long)&packSize + uVar15) = 0;
        }
        for (uVar15 = 0; local_e8 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined1 *)((long)&coderOutStreams + uVar15) = 0;
        }
        uVar15 = local_e8 & 0xffffffff;
        while (uVar23 = (int)uVar15 - 1, uVar15 = (ulong)uVar23, uVar23 != 0) {
          SVar6 = SzReadNumber32(&local_118,&index_1);
          if (SVar6 != 0) {
            return SVar6;
          }
          if (uVar25 <= index_1) {
            return 0x10;
          }
          if (*(char *)((long)&packSize + (ulong)index_1) != '\0') {
            return 0x10;
          }
          *(undefined1 *)((long)&packSize + (ulong)index_1) = 1;
          SVar6 = SzReadNumber32(&local_118,&index_1);
          if (SVar6 != 0) {
            return SVar6;
          }
          if ((uint)local_e8 <= index_1) {
            return 0x10;
          }
          cVar3 = *(char *)((long)&coderOutStreams + (ulong)index_1);
          *(char *)((long)&coderOutStreams + (ulong)index_1) = cVar3 + (cVar3 == '\0');
          if (cVar3 != '\0') {
            return 0x10;
          }
        }
        if (uVar14 != 1) {
          uVar23 = (int)local_e8 - 2;
          while (uVar23 = uVar23 + 1, uVar25 != uVar23) {
            SVar6 = SzReadNumber32(&local_118,&index_1);
            if (SVar6 != 0) {
              return SVar6;
            }
            if (uVar25 <= index_1) {
              return 0x10;
            }
            cVar3 = *(char *)((long)&packSize + (ulong)index_1);
            *(char *)((long)&packSize + (ulong)index_1) = cVar3 + (cVar3 == '\0');
            if (cVar3 != '\0') {
              return 0x10;
            }
          }
        }
        uVar15 = 0;
        while( true ) {
          if (local_e8 == uVar15) {
            return 0x10;
          }
          if (*(char *)((long)&coderOutStreams + uVar15) == '\0') break;
          uVar15 = uVar15 + 1;
        }
        if ((uint)local_e8 == (int)uVar15) {
          return 0x10;
        }
      }
      local_108->FoStartPackStreamIndex[local_c0] = local_ec;
      local_108->FoToCoderUnpackSizes[local_c0] = local_100;
      local_108->FoToMainUnpackSizeIndex[local_c0] = (Byte)uVar15;
      bVar27 = CARRY4(local_100,(uint)local_e8);
      local_100 = local_100 + (uint)local_e8;
      if (bVar27) {
        return 4;
      }
      bVar27 = CARRY4(local_ec,uVar14);
      local_ec = local_ec + uVar14;
      if (bVar27) {
        return 4;
      }
      sVar26 = local_c0 + 1;
      pCVar22 = local_108;
      if (local_108->NumPackStreams < local_ec) {
        return 0x10;
      }
    }
    pCVar22->FoToCoderUnpackSizes[(long)local_f8] = local_100;
    pCVar22->FoStartPackStreamIndex[(long)local_f8] = local_ec;
    sVar26 = (long)local_118.Data - (long)local_c8;
    pCVar22->FoCodersOffsets[(long)local_f8] = sVar26;
    local_e0 = sd;
    if (sVar26 == 0) {
      pCVar22 = (CSzAr *)0x0;
    }
    else {
      pBVar12 = (Byte *)(*alloc->Alloc)(alloc,sVar26);
      local_108->CodersData = pBVar12;
      if (pBVar12 == (Byte *)0x0) {
        return 2;
      }
      memcpy(pBVar12,local_c8,sVar26);
      pCVar22 = local_108;
    }
    if (BVar1 != '\0') {
      if (local_118.Size != 0) {
        return 0x10;
      }
      local_118.Data = local_e0->Data;
      local_118.Size = local_e0->Size;
    }
    SVar6 = WaitId(&local_118,0xc);
    if (SVar6 != 0) {
      return SVar6;
    }
    if (local_100 == 0) {
      pCVar22->CoderUnpackSizes = (UInt64 *)0x0;
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)local_100;
      pUVar9 = (UInt64 *)(*alloc->Alloc)(alloc,uVar15 * 8);
      pCVar22->CoderUnpackSizes = pUVar9;
      if (pUVar9 == (UInt64 *)0x0) {
        return 2;
      }
    }
    lVar16 = 0;
    while (uVar15 * 8 + 8 != lVar16 + 8) {
      SVar6 = ReadNumber(&local_118,(UInt64 *)(lVar16 + (long)pCVar22->CoderUnpackSizes));
      lVar16 = lVar16 + 8;
      if (SVar6 != 0) {
        return SVar6;
      }
    }
    p_00 = &pCVar22->FolderCRCs;
    while( true ) {
      SVar6 = ReadNumber(&local_118,&packSize);
      UVar20 = numFolders;
      if (SVar6 != 0) {
        return SVar6;
      }
      if (packSize != 10) break;
      SzBitUi32s_Free(p_00,alloc);
      SVar6 = ReadBitVector(&local_118,UVar20,&p_00->Defs,alloc);
      if (SVar6 != 0) {
        return SVar6;
      }
      iVar7 = ReadUi32s(&local_118,UVar20,p_00,alloc);
LAB_0059b60f:
      if (iVar7 != 0) {
        return iVar7;
      }
    }
    if (packSize != 0) {
      iVar7 = SkipData(&local_118);
      goto LAB_0059b60f;
    }
    local_e0->Data = local_118.Data;
    local_e0->Size = local_118.Size;
    SVar6 = ReadNumber(local_e0,&type);
    sd = local_e0;
    if (SVar6 != 0) {
      return SVar6;
    }
  }
  if (type == 8) {
    local_f8 = &ssi->sdNumSubStreams;
    packSize = 0;
    UVar20 = local_108->NumFolders;
    iVar7 = 0;
    UVar21 = 0;
    UVar19 = UVar20;
    while( true ) {
      SVar6 = ReadNumber(sd,&packSize);
      UVar5 = packSize;
      if (SVar6 != 0) {
        return SVar6;
      }
      if ((packSize - 9 < 2) || (packSize == 0)) break;
      if (packSize == 0xd) {
        local_f8->Data = sd->Data;
        UVar19 = 0;
        UVar21 = 0;
        for (uVar25 = 0; UVar20 != uVar25; uVar25 = uVar25 + 1) {
          SVar6 = SzReadNumber32(sd,&coderOutStreams);
          if (SVar6 != 0) {
            return SVar6;
          }
          bVar27 = CARRY4(UVar19,coderOutStreams);
          UVar19 = UVar19 + coderOutStreams;
          if (bVar27) {
            return 4;
          }
          iVar8 = coderOutStreams - 1;
          bVar27 = iVar8 != 0;
          if (coderOutStreams == 0) {
            iVar8 = 0;
          }
          if (((bVar27) || (pBVar12 = (local_108->FolderCRCs).Defs, pBVar12 == (Byte *)0x0)) ||
             (-1 < (char)(pBVar12[uVar25 >> 3] << ((byte)uVar25 & 7)))) {
            UVar21 = UVar21 + coderOutStreams;
          }
          iVar7 = iVar7 + iVar8;
        }
        (ssi->sdNumSubStreams).Size = (long)sd->Data - (long)(ssi->sdNumSubStreams).Data;
      }
      else {
        SVar6 = SkipData(sd);
        if (SVar6 != 0) {
          return SVar6;
        }
      }
    }
    if ((local_f8->Data == (Byte *)0x0) &&
       (pBVar12 = (local_108->FolderCRCs).Defs, UVar21 = UVar20, pBVar12 != (Byte *)0x0)) {
      UVar21 = CountDefinedBits(pBVar12,UVar20);
      UVar21 = UVar20 - UVar21;
    }
    ssi->NumTotalSubStreams = UVar19;
    ssi->NumSubDigests = UVar21;
    if (UVar5 == 9) {
      pbVar13 = sd->Data;
      (ssi->sdSizes).Data = pbVar13;
      uVar15 = sd->Size;
      while (bVar27 = iVar7 != 0, iVar7 = iVar7 + -1, bVar27) {
        if (uVar15 == 0) {
          return 0x10;
        }
        uVar24 = uVar15 - 1;
        bVar2 = *pbVar13;
        if ((char)bVar2 < '\0') {
          if ((bVar2 & 0x40) == 0) {
            if (uVar24 == 0) {
              return 0x10;
            }
            uVar15 = uVar15 - 2;
            pbVar13 = pbVar13 + 2;
          }
          else {
            pbVar13 = pbVar13 + 3;
            uVar15 = uVar15 - 3;
            uVar17 = 2;
            for (uVar18 = 0x20; ((uint)uVar17 < 8 && (((uint)uVar18 & (uint)bVar2) != 0));
                uVar18 = uVar18 >> 1) {
              pbVar13 = pbVar13 + 1;
              uVar15 = uVar15 - 1;
              uVar17 = uVar17 + 1;
            }
            if (uVar24 < uVar17) {
              return 0x10;
            }
          }
        }
        else {
          pbVar13 = pbVar13 + 1;
          uVar15 = uVar24;
        }
      }
      sd->Data = pbVar13;
      sd->Size = uVar15;
      (ssi->sdSizes).Size = (long)pbVar13 - (long)(ssi->sdSizes).Data;
      SVar6 = ReadNumber(sd,&packSize);
      if (SVar6 != 0) {
        return SVar6;
      }
    }
    do {
      if (packSize == 10) {
        (ssi->sdCRCs).Data = sd->Data;
        SVar6 = SkipBitUi32s(sd,UVar21);
        if (SVar6 != 0) {
          return SVar6;
        }
        (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
      }
      else {
        if (packSize == 0) {
          SVar6 = ReadNumber(sd,&type);
          if (SVar6 != 0) {
            return SVar6;
          }
          goto LAB_0059b771;
        }
        SVar6 = SkipData(sd);
        if (SVar6 != 0) {
          return SVar6;
        }
      }
      SVar6 = ReadNumber(sd,&packSize);
      if (SVar6 != 0) {
        return SVar6;
      }
    } while( true );
  }
  ssi->NumTotalSubStreams = local_108->NumFolders;
LAB_0059b771:
  return (uint)(type != 0) << 2;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    // ssi->NumSubDigests = 0;
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}